

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int archive_read_format_7zip_cleanup(archive_read *a)

{
  _7zip *zip_00;
  _7zip *zip;
  archive_read *a_local;
  
  zip_00 = (_7zip *)a->format->data;
  free_StreamsInfo((_7z_stream_info *)zip_00);
  free(zip_00->entries);
  free(zip_00->entry_names);
  free_decompression(a,zip_00);
  free(zip_00->uncompressed_buffer);
  free(zip_00->sub_stream_buff[0]);
  free(zip_00->sub_stream_buff[1]);
  free(zip_00->sub_stream_buff[2]);
  free(zip_00->tmp_stream_buff);
  free(zip_00);
  a->format->data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_read_format_7zip_cleanup(struct archive_read *a)
{
	struct _7zip *zip;

	zip = (struct _7zip *)(a->format->data);
	free_StreamsInfo(&(zip->si));
	free(zip->entries);
	free(zip->entry_names);
	free_decompression(a, zip);
	free(zip->uncompressed_buffer);
	free(zip->sub_stream_buff[0]);
	free(zip->sub_stream_buff[1]);
	free(zip->sub_stream_buff[2]);
	free(zip->tmp_stream_buff);
	free(zip);
	(a->format->data) = NULL;
	return (ARCHIVE_OK);
}